

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,Op op,uint32_t ty_id,uint32_t res_id,
          OperandList *in_operands)

{
  OperandList *this_00;
  uint32_t uVar1;
  uint32_t local_48;
  spv_operand_type_t local_44;
  initializer_list<unsigned_int> local_40;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_009309d8;
  this->context_ = c;
  this->opcode_ = op;
  this->has_type_id_ = ty_id != 0;
  this->has_result_id_ = res_id != 0;
  if (c->unique_id_ != 0xffffffff) {
    uVar1 = c->unique_id_ + 1;
    c->unique_id_ = uVar1;
    this->unique_id_ = uVar1;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->dbg_scope_).lexical_scope_ = 0;
    (this->dbg_scope_).inlined_at_ = 0;
    this_00 = &this->operands_;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
              (this_00,(((ulong)(res_id != 0) + 1) - (ulong)(ty_id == 0)) +
                       ((long)(in_operands->
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(in_operands->
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
              );
    if (this->has_type_id_ == true) {
      local_44 = SPV_OPERAND_TYPE_TYPE_ID;
      local_40._M_len = 1;
      local_48 = ty_id;
      local_40._M_array = &local_48;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this_00,
                 &local_44,&local_40);
    }
    if (this->has_result_id_ == true) {
      local_44 = SPV_OPERAND_TYPE_RESULT_ID;
      local_40._M_len = 1;
      local_48 = res_id;
      local_40._M_array = &local_48;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this_00,
                 &local_44,&local_40);
    }
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this_00,
               (this->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (in_operands->
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (in_operands->
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  __assert_fail("unique_id_ != std::numeric_limits<uint32_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.h"
                ,0x1fe,"uint32_t spvtools::opt::IRContext::TakeNextUniqueId()");
}

Assistant:

Instruction::Instruction(IRContext* c, spv::Op op, uint32_t ty_id,
                         uint32_t res_id, const OperandList& in_operands)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(op),
      has_type_id_(ty_id != 0),
      has_result_id_(res_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      operands_(),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {
  size_t operands_size = in_operands.size();
  if (has_type_id_) {
    operands_size++;
  }
  if (has_result_id_) {
    operands_size++;
  }
  operands_.reserve(operands_size);
  if (has_type_id_) {
    operands_.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_TYPE_ID,
                           std::initializer_list<uint32_t>{ty_id});
  }
  if (has_result_id_) {
    operands_.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_RESULT_ID,
                           std::initializer_list<uint32_t>{res_id});
  }
  operands_.insert(operands_.end(), in_operands.begin(), in_operands.end());
}